

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::Carve(PageHeap *this,Span *span,uint64_t n)

{
  uint64_t uVar1;
  bool bVar2;
  uint64_t npages;
  Span *span_00;
  Span *new_span;
  uint64_t extra;
  uint64_t old_location;
  uint64_t n_local;
  Span *span_local;
  PageHeap *this_local;
  
  uVar1 = span->location;
  span->location = 0;
  if (n < span->npages) {
    npages = span->npages - n;
    span_00 = NewSpan(span->page_id + n,npages);
    span->npages = n;
    if (span_00 == (Span *)0x0) {
      __assert_fail("new_span != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf5,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    bVar2 = PageMap::Set(&this->page_map_,(span->page_id + n) - 1,span);
    if (!bVar2) {
      __assert_fail("page_map_.Set(span->page_id + n - 1, span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf6,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    bVar2 = PageMap::Set(&this->page_map_,span_00->page_id,span_00);
    if (!bVar2) {
      __assert_fail("page_map_.Set(new_span->page_id, new_span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf7,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    bVar2 = PageMap::Set(&this->page_map_,(span_00->page_id + npages) - 1,span_00);
    if (!bVar2) {
      __assert_fail("page_map_.Set(new_span->page_id + extra -1, new_span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf8,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    span_00->location = uVar1;
    InsertToFreeList(this,span_00);
    (this->stat).in_used_bytes = span->npages * 0x2000 + (this->stat).in_used_bytes;
    bVar2 = CheckSmallList(this);
    if (!bVar2) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xfd,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
  }
  else {
    (this->stat).in_used_bytes = span->npages * 0x2000 + (this->stat).in_used_bytes;
  }
  return span;
}

Assistant:

Span* Carve(Span* span, uint64_t n) {
        auto old_location = span->location;
        span->location = Span::IN_USE;
        if (span->npages <= n) {
            stat.in_used_bytes += span->npages * spanPageSize;
            return span;
        }

        uint64_t extra = span->npages - n;
        Span* new_span = NewSpan(span->page_id + n, extra);

        span->npages = n;
        // oom
        assert(new_span != nullptr);
        assert(page_map_.Set(span->page_id + n - 1, span));
        assert(page_map_.Set(new_span->page_id, new_span));
        assert(page_map_.Set(new_span->page_id + extra -1, new_span));

        new_span->location = old_location;
        InsertToFreeList(new_span);
        stat.in_used_bytes += span->npages * spanPageSize;
        assert(CheckSmallList());
        return span;
    }